

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_LongLongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_Test
::testBody(TEST_MockReturnValueTest_LongLongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_Test
           *this)

{
  undefined8 uVar1;
  longlong lVar2;
  int iVar3;
  MockSupport *pMVar4;
  undefined4 extraout_var;
  MockExpectedCall *pMVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  UtestShell *pUVar6;
  undefined4 extraout_var_03;
  MockActualCall *pMVar7;
  cpputest_longlong cVar8;
  TestTerminator *pTVar9;
  undefined4 extraout_var_04;
  SimpleString local_250;
  MockNamedValue local_240;
  SimpleString local_1f0;
  SimpleString local_1e0;
  SimpleString local_1d0;
  MockNamedValue local_1c0;
  SimpleString local_170;
  MockNamedValue local_160;
  SimpleString local_110;
  SimpleString local_100;
  SimpleString local_f0;
  MockNamedValue local_e0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50 [2];
  SimpleString local_30;
  undefined8 local_20;
  longlong another_ret_value;
  longlong ret_value;
  TEST_MockReturnValueTest_LongLongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_Test
  *this_local;
  
  another_ret_value = 1;
  local_20 = 2;
  ret_value = (longlong)this;
  SimpleString::SimpleString(&local_30,"");
  pMVar4 = mock(&local_30,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_50,"foo");
  iVar3 = (*pMVar4->_vptr_MockSupport[3])(pMVar4,local_50);
  SimpleString::SimpleString(&local_60,"p1");
  pMVar5 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var,iVar3),&local_60,1);
  iVar3 = (*pMVar5->_vptr_MockExpectedCall[9])();
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0xe8))
            ((long *)CONCAT44(extraout_var_00,iVar3),another_ret_value);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(local_50);
  SimpleString::~SimpleString(&local_30);
  SimpleString::SimpleString(&local_70,"");
  pMVar4 = mock(&local_70,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_80,"foo");
  iVar3 = (*pMVar4->_vptr_MockSupport[3])(pMVar4,&local_80);
  SimpleString::SimpleString(&local_90,"p1");
  pMVar5 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var_01,iVar3),&local_90,1);
  iVar3 = (*pMVar5->_vptr_MockExpectedCall[9])();
  (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0xe8))
            ((long *)CONCAT44(extraout_var_02,iVar3),local_20);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  pUVar6 = UtestShell::getCurrent();
  lVar2 = another_ret_value;
  SimpleString::SimpleString(&local_f0,"");
  pMVar4 = mock(&local_f0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_100,"foo");
  iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_100);
  SimpleString::SimpleString(&local_110,"p1");
  pMVar7 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var_03,iVar3),&local_110,1);
  (*pMVar7->_vptr_MockActualCall[0x15])(&local_e0);
  cVar8 = MockNamedValue::getLongLongIntValue(&local_e0);
  pTVar9 = UtestShell::getCurrentTestTerminator();
  (*pUVar6->_vptr_UtestShell[0x10])
            (pUVar6,lVar2,cVar8,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x22d,pTVar9);
  MockNamedValue::~MockNamedValue(&local_e0);
  SimpleString::~SimpleString(&local_110);
  SimpleString::~SimpleString(&local_100);
  SimpleString::~SimpleString(&local_f0);
  pUVar6 = UtestShell::getCurrent();
  lVar2 = another_ret_value;
  SimpleString::SimpleString(&local_170,"");
  pMVar4 = mock(&local_170,(MockFailureReporter *)0x0);
  (*pMVar4->_vptr_MockSupport[8])(&local_160);
  cVar8 = MockNamedValue::getLongLongIntValue(&local_160);
  pTVar9 = UtestShell::getCurrentTestTerminator();
  (*pUVar6->_vptr_UtestShell[0x10])
            (pUVar6,lVar2,cVar8,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x22e,pTVar9);
  MockNamedValue::~MockNamedValue(&local_160);
  SimpleString::~SimpleString(&local_170);
  pUVar6 = UtestShell::getCurrent();
  uVar1 = local_20;
  SimpleString::SimpleString(&local_1d0,"");
  pMVar4 = mock(&local_1d0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_1e0,"foo");
  iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_1e0);
  SimpleString::SimpleString(&local_1f0,"p1");
  pMVar7 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var_04,iVar3),&local_1f0,1);
  (*pMVar7->_vptr_MockActualCall[0x15])(&local_1c0);
  cVar8 = MockNamedValue::getLongLongIntValue(&local_1c0);
  pTVar9 = UtestShell::getCurrentTestTerminator();
  (*pUVar6->_vptr_UtestShell[0x10])
            (pUVar6,uVar1,cVar8,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x22f,pTVar9);
  MockNamedValue::~MockNamedValue(&local_1c0);
  SimpleString::~SimpleString(&local_1f0);
  SimpleString::~SimpleString(&local_1e0);
  SimpleString::~SimpleString(&local_1d0);
  pUVar6 = UtestShell::getCurrent();
  uVar1 = local_20;
  SimpleString::SimpleString(&local_250,"");
  pMVar4 = mock(&local_250,(MockFailureReporter *)0x0);
  (*pMVar4->_vptr_MockSupport[8])(&local_240);
  cVar8 = MockNamedValue::getLongLongIntValue(&local_240);
  pTVar9 = UtestShell::getCurrentTestTerminator();
  (*pUVar6->_vptr_UtestShell[0x10])
            (pUVar6,uVar1,cVar8,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x230,pTVar9);
  MockNamedValue::~MockNamedValue(&local_240);
  SimpleString::~SimpleString(&local_250);
  return;
}

Assistant:

TEST(MockReturnValueTest, LongLongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored)
{
    long long int ret_value = 1;
    long long int another_ret_value = 2;

    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters().andReturnValue(ret_value);
    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters().andReturnValue(another_ret_value);

    LONGLONGS_EQUAL(ret_value, mock().actualCall("foo").withParameter("p1", 1).returnValue().getLongLongIntValue());
    LONGLONGS_EQUAL(ret_value, mock().returnValue().getLongLongIntValue());
    LONGLONGS_EQUAL(another_ret_value, mock().actualCall("foo").withParameter("p1", 1).returnValue().getLongLongIntValue());
    LONGLONGS_EQUAL(another_ret_value, mock().returnValue().getLongLongIntValue());
}